

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmerr.cpp
# Opt level: O2

int err_load_message_file
              (osfildef *fp,err_msg_t **arr,size_t *arr_size,err_msg_t *default_arr,
              size_t default_arr_size)

{
  int iVar1;
  size_t sVar2;
  err_msg_t *__s;
  char *__ptr;
  char *pcVar3;
  ulong uVar4;
  ulong __size;
  size_t sVar5;
  ulong __size_00;
  char buf [128];
  
  sVar2 = fread(buf,0x16,1,(FILE *)fp);
  if ((sVar2 == 1) && (iVar1 = bcmp(buf,"TADS3.Message.0001\n\r\x1a",0x16), iVar1 == 0)) {
    err_delete_message_array(arr,arr_size,default_arr,default_arr_size);
    sVar2 = fread(buf,2,1,(FILE *)fp);
    if (sVar2 == 1) {
      *arr_size = (ulong)(ushort)buf._0_2_;
      __s = (err_msg_t *)malloc((ulong)(ushort)buf._0_2_ * 0x18);
      *arr = __s;
      if (__s != (err_msg_t *)0x0) {
        sVar5 = *arr_size;
        memset(__s,0,sVar5 * 0x18);
        uVar4 = 0;
        while( true ) {
          if (sVar5 <= uVar4) {
            return 0;
          }
          sVar2 = fread(buf,8,1,(FILE *)fp);
          if (sVar2 != 1) break;
          __s->msgnum = buf._0_4_;
          __size_00 = (ulong)(ushort)buf._4_2_;
          __size = (ulong)(ushort)buf._6_2_;
          __ptr = (char *)malloc(__size_00 + 1);
          __s->short_msgtxt = __ptr;
          pcVar3 = (char *)malloc(__size + 1);
          __s->long_msgtxt = pcVar3;
          if ((((__ptr == (char *)0x0) || (pcVar3 == (char *)0x0)) ||
              (sVar2 = fread(__ptr,__size_00,1,(FILE *)fp), sVar2 != 1)) ||
             (sVar2 = fread(__s->long_msgtxt,__size,1,(FILE *)fp), sVar2 != 1)) break;
          __s->short_msgtxt[__size_00] = '\0';
          __s->long_msgtxt[__size] = '\0';
          uVar4 = uVar4 + 1;
          __s = __s + 1;
          sVar5 = *arr_size;
        }
      }
    }
  }
  err_delete_message_array(arr,arr_size,default_arr,default_arr_size);
  return 1;
}

Assistant:

int err_load_message_file(osfildef *fp,
                          const err_msg_t **arr, size_t *arr_size,
                          const err_msg_t *default_arr,
                          size_t default_arr_size)
{
    char buf[128];
    size_t i;
    err_msg_t *msg;
    
    /* read the file signature */
    if (osfrb(fp, buf, sizeof(VM_MESSAGE_FILE_SIGNATURE))
        || memcmp(buf, VM_MESSAGE_FILE_SIGNATURE,
                  sizeof(VM_MESSAGE_FILE_SIGNATURE)) != 0)
        goto fail;

    /* delete any previously-loaded message array */
    err_delete_message_array(arr, arr_size, default_arr, default_arr_size);

    /* read the message count */
    if (osfrb(fp, buf, 2))
        goto fail;

    /* set the new message count */
    *arr_size = osrp2(buf);

    /* allocate the message array */
    *arr = (err_msg_t *)t3malloc(*arr_size * sizeof(err_msg_t));
    if (*arr == 0)
        goto fail;

    /* clear the memory */
    memset((err_msg_t *)*arr, 0, *arr_size * sizeof(err_msg_t));

    /* read the individual messages */
    for (i = 0, msg = (err_msg_t *)*arr ; i < *arr_size ; ++i, ++msg)
    {
        size_t len1, len2;
        
        /* read the current message ID and the length of the two messages */
        if (osfrb(fp, buf, 8))
            goto fail;

        /* set the message ID */
        msg->msgnum = (int)t3rp4u(buf);

        /* get the short and long mesage lengths */
        len1 = osrp2(buf + 4);
        len2 = osrp2(buf + 6);

        /* allocate buffers */
        msg->short_msgtxt = (char *)t3malloc(len1 + 1);
        msg->long_msgtxt = (char *)t3malloc(len2 + 1);

        /* if either one failed, give up */
        if (msg->short_msgtxt == 0 || msg->long_msgtxt == 0)
            goto fail;

        /* read the two messages */
        if (osfrb(fp, (char *)msg->short_msgtxt, len1)
            || osfrb(fp, (char *)msg->long_msgtxt, len2))
            goto fail;

        /* null-terminate the strings */
        *(char *)(msg->short_msgtxt + len1) = '\0';
        *(char *)(msg->long_msgtxt + len2) = '\0';
    }

    /* success */
    return 0;

fail:
    /* revert back to the built-in array */
    err_delete_message_array(arr, arr_size,
                             default_arr, default_arr_size);

    /* indicate failure */
    return 1;
}